

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GcodePovray.cpp
# Opt level: O0

bool GenerateFineGeometryCuttingPlane
               (vector3 *start_vertex,vector3 *end_vertex,double half_offset_distance,
               double *param_4,double last_half_offset_distance,double *last_local_layer_height,
               double *cylinder_height,bool has_cutting_plane,CuttingPlane *cutting_plane,
               fstream *out)

{
  vector3 *pvVar1;
  bool bVar2;
  ostream *poVar3;
  double dVar4;
  double dVar5;
  vector3 local_3b8;
  vector3 local_3a0;
  undefined1 local_388 [8];
  vector3 temp_1;
  vector3 local_358;
  vector3 local_340;
  undefined1 local_328 [8];
  vector3 temp;
  vector3 local_2f8;
  vector3 local_2e0;
  vector3 local_2c8;
  vector3 local_2b0;
  vector3 local_298;
  undefined1 local_280 [8];
  vector3 initial_box_left_corner;
  vector3 initial_box_right_corner;
  undefined1 local_238 [8];
  vector3 target_center_point;
  double z_angle;
  vector3 rotate_vector;
  double y_length;
  double local_1c8;
  double x_length;
  double cone_top_radius;
  double cone_bottom_radius;
  vector3 local_198;
  vector3 local_180;
  vector3 local_168;
  vector3 local_150;
  vector3 local_138;
  vector3 local_120;
  vector3 local_108;
  undefined1 local_f0 [8];
  vector3 offset_vertex;
  vector3 link_vertex;
  vector3 right_end;
  vector3 right_start;
  vector3 left_end;
  vector3 left_start;
  double dStack_58;
  bool not_null;
  double distance_tolerance;
  bool need_to_cut;
  double *pdStack_48;
  bool has_cutting_plane_local;
  double *cylinder_height_local;
  double *last_local_layer_height_local;
  double last_half_offset_distance_local;
  double *local_layer_height_local;
  double half_offset_distance_local;
  vector3 *end_vertex_local;
  vector3 *start_vertex_local;
  
  distance_tolerance._6_1_ = 0;
  dStack_58 = 1.5;
  distance_tolerance._7_1_ = has_cutting_plane;
  pdStack_48 = cylinder_height;
  cylinder_height_local = last_local_layer_height;
  last_local_layer_height_local = (double *)last_half_offset_distance;
  last_half_offset_distance_local = (double)param_4;
  local_layer_height_local = (double *)half_offset_distance;
  half_offset_distance_local = (double)end_vertex;
  end_vertex_local = start_vertex;
  if (has_cutting_plane) {
    bVar2 = CuttingPlane::DeviationFromPlane
                      (cutting_plane,start_vertex,end_vertex,&stack0xffffffffffffffa8);
    if (bVar2) {
      bVar2 = CuttingPlane::OnPlanePositive
                        (cutting_plane,end_vertex_local,(vector3 *)half_offset_distance_local);
      if (!bVar2) {
        return false;
      }
      distance_tolerance._6_1_ = 0;
    }
    else {
      distance_tolerance._6_1_ = 1;
    }
  }
  else {
    distance_tolerance._6_1_ = 0;
  }
  vector3::vector3((vector3 *)&left_end.z);
  vector3::vector3((vector3 *)&right_start.z);
  vector3::vector3((vector3 *)&right_end.z);
  vector3::vector3((vector3 *)&link_vertex.z);
  vector3::operator-((vector3 *)&offset_vertex.z,(vector3 *)half_offset_distance_local,
                     end_vertex_local);
  vector3::vector3((vector3 *)local_f0,link_vertex.x,-offset_vertex.z,0.0);
  vector3::Uniform((vector3 *)local_f0);
  pvVar1 = end_vertex_local;
  vector3::operator*(&local_120,(vector3 *)local_f0,(double)local_layer_height_local);
  vector3::operator+(&local_108,pvVar1,&local_120);
  dVar4 = half_offset_distance_local;
  left_end.z = local_108.x;
  vector3::operator*(&local_150,(vector3 *)local_f0,(double)local_layer_height_local);
  vector3::operator+(&local_138,(vector3 *)dVar4,&local_150);
  right_start.z = local_138.x;
  left_end.x = local_138.y;
  left_end.y = local_138.z;
  vector3::Reverse((vector3 *)local_f0);
  pvVar1 = end_vertex_local;
  vector3::operator*(&local_180,(vector3 *)local_f0,(double)local_layer_height_local);
  vector3::operator+(&local_168,pvVar1,&local_180);
  dVar4 = half_offset_distance_local;
  right_end.z = local_168.x;
  right_start.x = local_168.y;
  right_start.y = local_168.z;
  vector3::operator*((vector3 *)&cone_bottom_radius,(vector3 *)local_f0,
                     (double)local_layer_height_local);
  vector3::operator+(&local_198,(vector3 *)dVar4,(vector3 *)&cone_bottom_radius);
  link_vertex.z = local_198.x;
  right_end.x = local_198.y;
  right_end.y = local_198.z;
  cone_top_radius = *(double *)last_half_offset_distance_local / 2.0;
  x_length = *cylinder_height_local / 2.0;
  vector3::operator-((vector3 *)&y_length,(vector3 *)&right_start.z,(vector3 *)&left_end.z);
  local_1c8 = vector3::Length((vector3 *)&y_length);
  vector3::operator-((vector3 *)&rotate_vector.z,(vector3 *)&right_end.z,(vector3 *)&left_end.z);
  dVar4 = vector3::Length((vector3 *)&rotate_vector.z);
  vector3::operator-((vector3 *)&z_angle,(vector3 *)&right_start.z,(vector3 *)&left_end.z);
  target_center_point.z = vector3::GetZAngle((vector3 *)&z_angle);
  vector3::operator+((vector3 *)&initial_box_right_corner.z,end_vertex_local,
                     (vector3 *)half_offset_distance_local);
  vector3::operator*((vector3 *)local_238,(vector3 *)&initial_box_right_corner.z,0.5);
  vector3::vector3((vector3 *)&initial_box_left_corner.z,local_1c8 / 2.0,dVar4 / 2.0,0.0);
  vector3::vector3((vector3 *)local_280,-local_1c8 / 2.0,-dVar4 / 2.0,
                   -*(double *)last_half_offset_distance_local);
  if ((((*cylinder_height_local != 0.0) || (NAN(*cylinder_height_local))) ||
      (*(double *)last_half_offset_distance_local != 0.0)) ||
     (NAN(*(double *)last_half_offset_distance_local))) {
    vector3::operator-(&local_298,end_vertex_local,(vector3 *)half_offset_distance_local);
    dVar5 = vector3::Length(&local_298);
    if ((dVar5 != 0.0) || (NAN(dVar5))) {
      if ((distance_tolerance._6_1_ & 1) != 0) {
        std::operator<<((ostream *)(out + 0x10),"intersection{\n");
        operator<<((ostream *)(out + 0x10),cutting_plane);
      }
      std::operator<<((ostream *)(out + 0x10),"union{\n");
      poVar3 = std::operator<<((ostream *)(out + 0x10),"cone\n{ ");
      vector3::MoveDownRadius(&local_2b0,(vector3 *)&left_end.z,x_length);
      poVar3 = operator<<(poVar3,&local_2b0);
      poVar3 = std::operator<<(poVar3,",");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,x_length);
      poVar3 = std::operator<<(poVar3,"\n");
      vector3::MoveDownRadius(&local_2c8,(vector3 *)&right_start.z,cone_top_radius);
      poVar3 = operator<<(poVar3,&local_2c8);
      poVar3 = std::operator<<(poVar3,",");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,cone_top_radius);
      std::operator<<(poVar3,"\n}\n");
      poVar3 = std::operator<<((ostream *)(out + 0x10),"cone\n{ ");
      vector3::MoveDownRadius(&local_2e0,(vector3 *)&right_end.z,x_length);
      poVar3 = operator<<(poVar3,&local_2e0);
      poVar3 = std::operator<<(poVar3,",");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,x_length);
      poVar3 = std::operator<<(poVar3,"\n");
      vector3::MoveDownRadius(&local_2f8,(vector3 *)&link_vertex.z,cone_top_radius);
      poVar3 = operator<<(poVar3,&local_2f8);
      poVar3 = std::operator<<(poVar3,",");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,cone_top_radius);
      std::operator<<(poVar3,"\n}\n");
      poVar3 = std::operator<<((ostream *)(out + 0x10),"box\n{");
      poVar3 = operator<<(poVar3,(vector3 *)local_280);
      poVar3 = std::operator<<(poVar3,",");
      poVar3 = operator<<(poVar3,(vector3 *)&initial_box_left_corner.z);
      poVar3 = std::operator<<(poVar3,"\nrotate z*");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,target_center_point.z);
      poVar3 = std::operator<<(poVar3,"\ntranslate ");
      poVar3 = operator<<(poVar3,(vector3 *)local_238);
      std::operator<<(poVar3,"\n}\n");
      if ((*cylinder_height_local != 0.0) || (NAN(*cylinder_height_local))) {
        poVar3 = std::operator<<((ostream *)(out + 0x10),"torus\n{");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,dVar4 / 2.0);
        poVar3 = std::operator<<(poVar3,", ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,x_length);
        poVar3 = std::operator<<(poVar3,"\nrotate x*90 \ntranslate ");
        vector3::MoveDownRadius((vector3 *)&temp.z,end_vertex_local,x_length);
        poVar3 = operator<<(poVar3,(vector3 *)&temp.z);
        std::operator<<(poVar3,"\n}\n");
        vector3::MoveDownRadius((vector3 *)local_328,end_vertex_local,*cylinder_height_local);
        vector3::operator-(&local_340,end_vertex_local,(vector3 *)local_328);
        dVar5 = vector3::Length(&local_340);
        if ((dVar5 != 0.0) || (NAN(dVar5))) {
          poVar3 = std::operator<<((ostream *)(out + 0x10),"cylinder\n{");
          vector3::MoveDownRadius(&local_358,end_vertex_local,*cylinder_height_local);
          poVar3 = operator<<(poVar3,&local_358);
          poVar3 = std::operator<<(poVar3,", ");
          poVar3 = operator<<(poVar3,end_vertex_local);
          poVar3 = std::operator<<(poVar3,",");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,dVar4 / 2.0);
          std::operator<<(poVar3,"\n}\n");
        }
      }
      if ((*(double *)last_half_offset_distance_local != 0.0) ||
         (NAN(*(double *)last_half_offset_distance_local))) {
        poVar3 = std::operator<<((ostream *)(out + 0x10),"torus\n{");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,dVar4 / 2.0);
        poVar3 = std::operator<<(poVar3,", ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,cone_top_radius);
        poVar3 = std::operator<<(poVar3,"\nrotate x*90 \ntranslate ");
        vector3::MoveDownRadius
                  ((vector3 *)&temp_1.z,(vector3 *)half_offset_distance_local,cone_top_radius);
        poVar3 = operator<<(poVar3,(vector3 *)&temp_1.z);
        std::operator<<(poVar3,"\n}\n");
        vector3::MoveDownRadius
                  ((vector3 *)local_388,(vector3 *)half_offset_distance_local,
                   *(double *)last_half_offset_distance_local);
        vector3::operator-(&local_3a0,(vector3 *)half_offset_distance_local,(vector3 *)local_388);
        dVar5 = vector3::Length(&local_3a0);
        if ((dVar5 != 0.0) || (NAN(dVar5))) {
          poVar3 = std::operator<<((ostream *)(out + 0x10),"cylinder\n{");
          vector3::MoveDownRadius
                    (&local_3b8,(vector3 *)half_offset_distance_local,
                     *(double *)last_half_offset_distance_local);
          poVar3 = operator<<(poVar3,&local_3b8);
          poVar3 = std::operator<<(poVar3,", ");
          poVar3 = operator<<(poVar3,(vector3 *)half_offset_distance_local);
          poVar3 = std::operator<<(poVar3,",");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,dVar4 / 2.0);
          std::operator<<(poVar3,"\n}\n");
        }
      }
      if ((distance_tolerance._6_1_ & 1) != 0) {
        std::operator<<((ostream *)(out + 0x10),"}\n");
      }
      std::operator<<((ostream *)(out + 0x10),"texture{ GcodeTexture }\n");
      std::operator<<((ostream *)(out + 0x10),"}\n");
      start_vertex_local._7_1_ = true;
    }
    else {
      start_vertex_local._7_1_ = false;
    }
  }
  else {
    start_vertex_local._7_1_ = false;
  }
  return start_vertex_local._7_1_;
}

Assistant:

bool GenerateFineGeometryCuttingPlane(vector3 &start_vertex, vector3 &end_vertex, double half_offset_distance, const double &local_layer_height, double last_half_offset_distance, const double &last_local_layer_height, const double &cylinder_height, bool has_cutting_plane, CuttingPlane &cutting_plane, fstream &out)
{
  bool need_to_cut = false;
  double distance_tolerance = NOZZLE_DIAMETER;

  bool not_null = false;

  if (!has_cutting_plane)
  {
    need_to_cut = false;
  }
  else
  {
    if (cutting_plane.DeviationFromPlane(start_vertex, end_vertex, distance_tolerance))
    {
      if (cutting_plane.OnPlanePositive(start_vertex, end_vertex))
      {
        need_to_cut = false;
      }
      else
      {
        return not_null;
      }
    }
    else
    {
      need_to_cut = true;
    }
  }

  vector3 left_start, left_end, right_start, right_end;
  vector3 link_vertex = end_vertex - start_vertex;
  vector3 offset_vertex(link_vertex.y, -link_vertex.x, 0);
  offset_vertex.Uniform();

  left_start = start_vertex + offset_vertex * half_offset_distance;
  left_end = end_vertex + offset_vertex * half_offset_distance;

  offset_vertex.Reverse();
  right_start = start_vertex + offset_vertex * half_offset_distance;
  right_end = end_vertex + offset_vertex * half_offset_distance;

  //vector3 local_x_axis, local_y_axis;
  //local_x_axis = left_end - left_start;
  //local_y_axis = right_start - left_start;
  //local_x_axis.Uniform();
  //local_y_axis.Uniform();
  //vector3 local_origin = left_start.MoveDownRadius(local_layer_height);
  //vector3 corner_link = right_end - local_origin;
  //double local_x_coordinate = corner_link * local_x_axis;
  //double local_y_coordinate = corner_link * local_y_axis;
  double cone_bottom_radius = local_layer_height / 2;
  double cone_top_radius = last_local_layer_height / 2;
  //vector3 box_corner_vertex(local_x_coordinate, local_y_coordinate, local_layer_height);


  double x_length = (left_end - left_start).Length();
  double y_length = (right_start - left_start).Length();
  vector3 rotate_vector = left_end - left_start;
  //   double x_angle = rotate_vector.GetXAngle();
  //   double y_angle = rotate_vector.GetYAngle();
  double z_angle = rotate_vector.GetZAngle();
  vector3 target_center_point = (start_vertex + end_vertex) * 0.5;
  vector3 initial_box_right_corner(x_length / 2, y_length / 2, 0);
  vector3 initial_box_left_corner(-x_length / 2, -y_length / 2, -local_layer_height);

  if (last_local_layer_height == 0 && local_layer_height == 0)
  {
    return not_null;
  }

  if ((start_vertex - end_vertex).Length() == 0)
  {
    return not_null;
  }

  not_null = true;

  if (need_to_cut)
  {
    out << "intersection{\n";
    out << cutting_plane;
  }

  out << "union{\n";

  out << "cone\n\
{ " << left_start.MoveDownRadius(cone_top_radius) << "," << cone_top_radius << "\n" << left_end.MoveDownRadius(cone_bottom_radius) << "," << cone_bottom_radius << "\n\
}\n";

  out << "cone\n\
{ " << right_start.MoveDownRadius(cone_top_radius) << "," << cone_top_radius << "\n" << right_end.MoveDownRadius(cone_bottom_radius) << "," << cone_bottom_radius << "\n\
}\n";

  out << "box\n\
{" << initial_box_left_corner << "," << initial_box_right_corner << "\n\
rotate z*" << z_angle << "\n\
translate " << target_center_point << "\n\
}\n";

  if (last_local_layer_height != 0)
  {
    out << "torus\n\
{" << y_length / 2 << ", " << cone_top_radius << "\n\
rotate x*90 \n\
translate " << (start_vertex).MoveDownRadius(cone_top_radius) << "\n\
}\n";

    vector3 temp = (start_vertex).MoveDownRadius(last_local_layer_height);
    if ((start_vertex - temp).Length() != 0)
    {
      out << "cylinder\n\
{" << (start_vertex).MoveDownRadius(last_local_layer_height) << ", " << (start_vertex) << "," << y_length / 2 << "\n\
}\n";
    }
  }

  if (local_layer_height != 0)
  {
    out << "torus\n\
{" << y_length / 2 << ", " << cone_bottom_radius << "\n\
rotate x*90 \n\
translate " << (end_vertex).MoveDownRadius(cone_bottom_radius) << "\n\
}\n";

    vector3 temp = (end_vertex).MoveDownRadius(local_layer_height);
    if ((end_vertex - temp).Length() != 0)
    {
      out << "cylinder\n\
{" << (end_vertex).MoveDownRadius(local_layer_height) << ", " << (end_vertex) << "," << y_length / 2 << "\n\
}\n";
    }
  }

  if (need_to_cut)
  {
    out << "}\n";
  }

  out << "texture{ GcodeTexture }\n";
  out << "}\n";

  return not_null;
}